

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O2

unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> __thiscall
verilogAST::SliceBlacklister::visit
          (SliceBlacklister *this,
          unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *node)

{
  undefined1 uVar1;
  long *plVar2;
  Transformer TVar3;
  long *in_RDX;
  Transformer local_30;
  long *local_28;
  
  uVar1 = *(undefined1 *)
           &node[3]._M_t.
            super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>._M_t.
            super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
            super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl;
  *(undefined1 *)
   &node[3]._M_t.super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>.
    _M_t.super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
    super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl = 1;
  local_28 = (long *)*in_RDX;
  *in_RDX = 0;
  Transformer::visit(&local_30,node);
  TVar3._vptr_Transformer = local_30._vptr_Transformer;
  local_30._vptr_Transformer = (_func_int **)0x0;
  plVar2 = (long *)*in_RDX;
  *in_RDX = (long)TVar3._vptr_Transformer;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x10))();
    if (local_30._vptr_Transformer != (_func_int **)0x0) {
      (**(code **)(*local_30._vptr_Transformer + 0x10))();
    }
  }
  local_30._vptr_Transformer = (_func_int **)0x0;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x10))();
  }
  *(undefined1 *)
   &node[3]._M_t.super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>.
    _M_t.super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
    super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl = uVar1;
  (this->super_Blacklister).super_Transformer._vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Slice> SliceBlacklister::visit(std::unique_ptr<Slice> node) {
  bool prev = this->blacklist;
  this->blacklist = true;
  node = Transformer::visit(std::move(node));
  // Restore prev value, since we could be nested inside an slice
  this->blacklist = prev;
  return node;
}